

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis)

{
  ulong uVar1;
  char *__dest;
  long *in_RSI;
  undefined8 *in_RDI;
  char *ptr_1;
  char *ptr;
  int size;
  void *data;
  int local_24;
  char *local_20 [3];
  char *local_8;
  
  in_RDI[4] = in_RSI;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0x7fffffff;
  uVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_20,&local_24);
  if ((uVar1 & 1) == 0) {
    *(undefined4 *)((long)in_RDI + 0x54) = 0;
    in_RDI[2] = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    in_RDI[1] = in_RDI + 5;
    *in_RDI = in_RDI + 5;
    local_8 = (char *)(in_RDI + 5);
  }
  else {
    *(int *)((long)in_RDI + 0x54) = *(int *)((long)in_RDI + 0x54) - local_24;
    if (local_24 < 0x11) {
      in_RDI[1] = in_RDI + 7;
      *in_RDI = in_RDI + 7;
      in_RDI[2] = in_RDI + 5;
      __dest = (char *)((long)in_RDI + (0x48 - (long)local_24));
      memcpy(__dest,local_20[0],(long)local_24);
      local_8 = __dest;
    }
    else {
      *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) - (local_24 + -0x10);
      in_RDI[1] = local_20[0] + (long)local_24 + -0x10;
      *in_RDI = local_20[0] + (long)local_24 + -0x10;
      in_RDI[2] = in_RDI + 5;
      if (in_RDI[9] == 1) {
        in_RDI[9] = 2;
      }
      local_8 = local_20[0];
    }
  }
  return local_8;
}

Assistant:

const char* EpsCopyInputStream::InitFrom(io::ZeroCopyInputStream* zcis) {
  zcis_ = zcis;
  const void* data;
  int size;
  limit_ = INT_MAX;
  if (zcis->Next(&data, &size)) {
    overall_limit_ -= size;
    if (size > kSlopBytes) {
      auto ptr = static_cast<const char*>(data);
      limit_ -= size - kSlopBytes;
      limit_end_ = buffer_end_ = ptr + size - kSlopBytes;
      next_chunk_ = buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return ptr;
    } else {
      limit_end_ = buffer_end_ = buffer_ + kSlopBytes;
      next_chunk_ = buffer_;
      auto ptr = buffer_ + 2 * kSlopBytes - size;
      std::memcpy(ptr, data, size);
      return ptr;
    }
  }
  overall_limit_ = 0;
  next_chunk_ = nullptr;
  size_ = 0;
  limit_end_ = buffer_end_ = buffer_;
  return buffer_;
}